

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t unpack_16bit(exr_decode_pipeline_t *decode)

{
  int iVar1;
  int iVar2;
  exr_coding_channel_info_t *peVar3;
  uint uVar4;
  long lVar5;
  uint8_t *__dest;
  long lVar6;
  ulong uVar7;
  void *__src;
  
  __src = decode->unpacked_buffer;
  if (0 < (long)decode->channel_count) {
    lVar6 = 0;
    do {
      __src = (void *)((long)__src +
                      (long)(*(int *)((long)&decode->channels->width + lVar6) *
                            decode->user_line_begin_skip * 2));
      lVar6 = lVar6 + 0x30;
    } while ((long)decode->channel_count * 0x30 != lVar6);
  }
  uVar4 = (decode->chunk).height - (decode->user_line_end_ignore + decode->user_line_begin_skip);
  if (0 < (int)uVar4) {
    uVar7 = 0;
    do {
      if (0 < decode->channel_count) {
        lVar6 = 0;
        do {
          peVar3 = decode->channels;
          iVar1 = peVar3[lVar6].width;
          iVar2 = peVar3[lVar6].user_pixel_stride;
          __dest = peVar3[lVar6].field_12.decode_to_ptr +
                   (long)peVar3[lVar6].user_line_stride * uVar7;
          if ((long)iVar2 == 2) {
            memcpy(__dest,__src,(long)iVar1 * 2);
          }
          else if (0 < iVar1) {
            lVar5 = 0;
            do {
              *(undefined2 *)__dest = *(undefined2 *)((long)__src + lVar5 * 2);
              __dest = __dest + iVar2;
              lVar5 = lVar5 + 1;
            } while (iVar1 != (int)lVar5);
          }
          __src = (void *)((long)__src + (long)(iVar1 * 2));
          lVar6 = lVar6 + 1;
        } while (lVar6 < decode->channel_count);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar4);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t* srcbuffer = decode->unpacked_buffer;
    uint8_t*       cdata;
    int            w, h, pixincrement;

    h = decode->chunk.height - decode->user_line_end_ignore;
    /*
     * if we have user_line_begin_skip, the user data pointer is at THAT
     * offset but our unpacked data is at y of '0' (well idx * height)
     */
    for (int c = 0; c < decode->channel_count; ++c)
    {
        exr_coding_channel_info_t* decc = (decode->channels + c);
        srcbuffer += decc->width * decode->user_line_begin_skip * 2;
    }
    h -= decode->user_line_begin_skip;

    for (int y = 0; y < h; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata        = decc->decode_to_ptr;
            w            = decc->width;
            pixincrement = decc->user_pixel_stride;
            cdata += (uint64_t) y * (uint64_t) decc->user_line_stride;
            /* specialize to memcpy if we can */
#if EXR_HOST_IS_NOT_LITTLE_ENDIAN
            if (pixincrement == 2)
            {
                uint16_t*       tmp = (uint16_t*) cdata;
                const uint16_t* src = (const uint16_t*) srcbuffer;
                uint16_t*       end = tmp + w;

                while (tmp < end)
                    *tmp++ = one_to_native16 (*src++);
            }
            else
            {
                const uint16_t* src = (const uint16_t*) srcbuffer;
                for (int x = 0; x < w; ++x)
                {
                    *((uint16_t*) cdata) = one_to_native16 (*src++);
                    cdata += pixincrement;
                }
            }
#else
            if (pixincrement == 2)
            {
                memcpy (cdata, srcbuffer, (size_t) (w) * 2);
            }
            else
            {
                const uint16_t* src = (const uint16_t*) srcbuffer;
                for (int x = 0; x < w; ++x)
                {
                    *((uint16_t*) cdata) = *src++;
                    cdata += pixincrement;
                }
            }
#endif
            srcbuffer += w * 2;
        }
    }
    return EXR_ERR_SUCCESS;
}